

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

void core::image::save_file(ConstPtr *image,string *filename)

{
  size_type *psVar1;
  int iVar2;
  pointer pcVar3;
  ulong uVar4;
  Exception *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  size_type *local_d0;
  string fext4;
  ulong local_a8;
  undefined1 local_a0 [16];
  ConstPtr local_90;
  ConstPtr local_80;
  ConstPtr local_70;
  ConstPtr local_60;
  size_type *local_50;
  string fext5;
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)filename);
  local_d0 = &fext4._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_50,fext5._M_dataplus._M_p + (long)local_50);
  if (fext5._M_dataplus._M_p != (pointer)0x0) {
    pcVar3 = (pointer)0x0;
    do {
      if ((byte)(*(byte *)((long)local_d0 + (long)pcVar3) + 0xbf) < 0x1a) {
        *(byte *)((long)local_d0 + (long)pcVar3) = *(byte *)((long)local_d0 + (long)pcVar3) | 0x20;
      }
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 < fext5._M_dataplus._M_p);
  }
  psVar1 = &fext5._M_string_length;
  if (local_50 != psVar1) {
    operator_delete(local_50);
  }
  std::__cxx11::string::substr((ulong)((long)&fext4.field_2 + 8),(ulong)filename);
  local_50 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,fext4.field_2._8_8_,local_a8 + fext4.field_2._8_8_);
  if (local_a8 != 0) {
    uVar4 = 0;
    do {
      if ((byte)(*(byte *)((long)local_50 + uVar4) + 0xbf) < 0x1a) {
        *(byte *)((long)local_50 + uVar4) = *(byte *)((long)local_50 + uVar4) | 0x20;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_a8);
  }
  if ((undefined1 *)fext4.field_2._8_8_ != local_a0) {
    operator_delete((void *)fext4.field_2._8_8_);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_d0);
  if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_50), iVar2 == 0)) {
    local_90.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
    local_90.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_90.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_90.
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_90.
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    save_jpg_file(&local_90,filename,0x55);
    this_00._M_pi =
         local_90.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar2 == 0) {
      local_80.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (image->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_80.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_refcount._M_pi;
      if (local_80.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_80.
                super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_80.
                super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      save_png_file(&local_80,filename,1);
      this_00._M_pi =
           local_80.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_d0);
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_50), iVar2 == 0)) {
        local_70.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (image->
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_70.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (image->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if (local_70.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_70.
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_70.
                  super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_70.
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_70.
                  super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        save_tiff_file(&local_70,filename);
        this_00._M_pi =
             local_70.
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_d0);
        if (iVar2 != 0) {
          this = (Exception *)__cxa_allocate_exception(0x28);
          fext4.field_2._8_8_ = local_a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)((long)&fext4.field_2 + 8),"Output filetype not supported","");
          util::Exception::Exception(this,(string *)((long)&fext4.field_2 + 8));
          __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
        }
        local_60.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (image->
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_60.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (image->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if (local_60.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_60.
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.
                  super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_60.
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_60.
                  super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        save_ppm_file(&local_60,filename);
        this_00._M_pi =
             local_60.
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
    }
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (local_50 != psVar1) {
    operator_delete(local_50);
  }
  if (local_d0 != &fext4._M_string_length) {
    operator_delete(local_d0);
  }
  return;
}

Assistant:

void
save_file (ByteImage::ConstPtr image, std::string const& filename)
{
    using namespace util::string;
    std::string fext4 = lowercase(right(filename, 4));
    std::string fext5 = lowercase(right(filename, 5));

#ifndef MVE_NO_JPEG_SUPPORT
    if (fext4 == ".jpg" || fext5 == ".jpeg")
    {
        save_jpg_file(image, filename, 85);
        return;
    }
#endif

#ifndef MVE_NO_PNG_SUPPORT
    if (fext4 == ".png")
    {
        save_png_file(image, filename);
        return;
    }
#endif

#ifndef MVE_NO_TIFF_SUPPORT
    if (fext4 == ".tif" || fext5 == ".tiff")
    {
        save_tiff_file(image, filename);
        return;
    }
#endif

    if (fext4 == ".ppm")
    {
        save_ppm_file(image, filename);
        return;
    }

    throw util::Exception("Output filetype not supported");
}